

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::fuse_innerproduct_batchnorm(NetOptimize *this)

{
  pointer *ppMVar1;
  float fVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  long lVar8;
  pointer pMVar9;
  pointer pMVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  size_type sVar15;
  long lVar16;
  ulong uVar17;
  size_type __n;
  ulong uVar18;
  ulong uVar19;
  size_type sVar20;
  float fVar21;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_a8;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar3 = (this->super_ModelWriter).layers;
  lVar16 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar16 != 0) {
    uVar17 = lVar16 >> 3;
    lVar16 = 0;
    do {
      iVar11 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar16]->type);
      if (iVar11 == 0) {
        uVar18 = lVar16 + 1;
        uVar19 = uVar18;
        if (uVar18 < uVar17) {
          iVar11 = *((((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar16]->tops).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          do {
            iVar12 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar18]->type);
            if (((iVar12 == 0) &&
                (pLVar4 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar18],
                piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar5 == 4)) &&
               (uVar19 = uVar18, *piVar5 == iVar11)) break;
            uVar18 = uVar18 + 1;
            uVar19 = uVar17;
          } while (uVar18 < uVar17);
        }
        if (uVar19 != uVar17) {
          ppLVar6 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar4 = ppLVar6[lVar16];
          pLVar7 = ppLVar6[uVar19];
          fprintf(_stderr,"fuse_innerproduct_batchnorm %s %s\n",(pLVar4->name)._M_dataplus._M_p);
          iVar11 = *(int *)&pLVar7[1]._vptr_Layer;
          __n = (size_type)iVar11;
          fVar2 = *(float *)((long)&pLVar7[1]._vptr_Layer + 4);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_48,__n,(allocator_type *)&local_a8);
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_60,__n,(allocator_type *)&local_a8);
          if (0 < iVar11) {
            sVar20 = 0;
            do {
              fVar21 = (float)pLVar7[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage[sVar20] + fVar2;
              if (fVar21 < 0.0) {
                fVar21 = sqrtf(fVar21);
              }
              else {
                fVar21 = SQRT(fVar21);
              }
              lVar8 = *(long *)&pLVar7[1].one_blob_only;
              local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[sVar20] =
                   *(float *)(*(long *)&pLVar7[2].support_tensor_storage + sVar20 * 4) -
                   (*(float *)(lVar8 + sVar20 * 4) *
                   *(float *)(pLVar7[1].name._M_dataplus._M_p + sVar20 * 4)) / fVar21;
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[sVar20] = *(float *)(lVar8 + sVar20 * 4) / fVar21;
              sVar20 = sVar20 + 1;
            } while (__n != sVar20);
          }
          if (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 0) {
            *(undefined4 *)((long)&pLVar4[1]._vptr_Layer + 4) = 1;
            local_a8.cstep = 0;
            local_a8.data = (pointer)0x0;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = 0;
            local_a8.elemsize._4_4_ = 0;
            local_a8.elempack = 0;
            local_a8.h = 0;
            local_a8.d = 0;
            local_a8.c = 0;
            local_a8.allocator = (Allocator *)0x0;
            local_a8.dims = 0;
            local_a8.w = 0;
            ncnn::Mat::create(&local_a8,iVar11,4,(Allocator *)0x0);
            ppMVar1 = &pLVar4[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if ((Mat *)ppMVar1 != &local_a8) {
              piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + 1;
                UNLOCK();
              }
              pMVar9 = pLVar4[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              if (pMVar9 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar9->data = *(int *)&pMVar9->data + -1;
                UNLOCK();
                if (*(int *)&pMVar9->data == 0) {
                  pMVar9 = pLVar4[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  pMVar10 = pLVar4[1].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                  if (pMVar10 == (pointer)0x0) {
                    if (pMVar9 != (pointer)0x0) {
                      free(pMVar9);
                    }
                  }
                  else {
                    (**(code **)((long)pMVar10->data + 0x18))();
                  }
                }
              }
              pLVar4[2].support_reserved_6 = false;
              pLVar4[2].support_reserved_7 = false;
              pLVar4[2].support_reserved_8 = false;
              pLVar4[2].support_reserved_9 = false;
              pLVar4[2].support_reserved_10 = false;
              pLVar4[2].support_reserved_11 = false;
              pLVar4[2].support_reserved_12 = false;
              pLVar4[2].support_reserved_13 = false;
              *(undefined8 *)
               ((long)&pLVar4[1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = 0;
              *(undefined8 *)
               ((long)&pLVar4[1].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              *ppMVar1 = (pointer)0x0;
              pLVar4[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pLVar4[2]._vptr_Layer = (_func_int **)0x0;
              pLVar4[2].one_blob_only = false;
              pLVar4[2].support_inplace = false;
              pLVar4[2].support_vulkan = false;
              pLVar4[2].support_packing = false;
              pLVar4[2].support_bf16_storage = false;
              pLVar4[2].support_fp16_storage = false;
              pLVar4[2].support_int8_storage = false;
              pLVar4[2].support_image_storage = false;
              pLVar4[2].support_tensor_storage = false;
              pLVar4[2].support_reserved_00 = false;
              pLVar4[2].support_reserved_0 = false;
              pLVar4[2].support_reserved_1 = false;
              pLVar4[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_a8.data;
              pLVar4[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              *(ulong *)&pLVar4[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data =
                   CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
              *(int *)&pLVar4[1].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_a8.elempack;
              pLVar4[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)local_a8.allocator;
              *(int *)&pLVar4[2]._vptr_Layer = local_a8.dims;
              *(int *)((long)&pLVar4[2]._vptr_Layer + 4) = local_a8.w;
              pLVar4[2].one_blob_only = (bool)(undefined1)local_a8.h;
              pLVar4[2].support_inplace = (bool)local_a8.h._1_1_;
              pLVar4[2].support_vulkan = (bool)local_a8.h._2_1_;
              pLVar4[2].support_packing = (bool)local_a8.h._3_1_;
              pLVar4[2].support_bf16_storage = (bool)(undefined1)local_a8.d;
              pLVar4[2].support_fp16_storage = (bool)local_a8.d._1_1_;
              pLVar4[2].support_int8_storage = (bool)local_a8.d._2_1_;
              pLVar4[2].support_image_storage = (bool)local_a8.d._3_1_;
              pLVar4[2].support_tensor_storage = (bool)(undefined1)local_a8.c;
              pLVar4[2].support_reserved_00 = (bool)local_a8.c._1_1_;
              pLVar4[2].support_reserved_0 = (bool)local_a8.c._2_1_;
              pLVar4[2].support_reserved_1 = (bool)local_a8.c._3_1_;
              pLVar4[2].support_reserved_6 = (bool)(undefined1)local_a8.cstep;
              pLVar4[2].support_reserved_7 = (bool)local_a8.cstep._1_1_;
              pLVar4[2].support_reserved_8 = (bool)local_a8.cstep._2_1_;
              pLVar4[2].support_reserved_9 = (bool)local_a8.cstep._3_1_;
              pLVar4[2].support_reserved_10 = (bool)local_a8.cstep._4_1_;
              pLVar4[2].support_reserved_11 = (bool)local_a8.cstep._5_1_;
              pLVar4[2].support_reserved_12 = (bool)local_a8.cstep._6_1_;
              pLVar4[2].support_reserved_13 = (bool)local_a8.cstep._7_1_;
            }
            piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if ((pointer)local_a8.allocator == (pointer)0x0) {
                  if ((pointer)local_a8.data != (pointer)0x0) {
                    free(local_a8.data);
                  }
                }
                else {
                  (**(code **)((long)(local_a8.allocator)->_vptr_Allocator + 0x18))();
                }
              }
            }
            local_a8.cstep = 0;
            local_a8.data = (void *)0x0;
            local_a8.refcount._0_4_ = 0;
            local_a8.refcount._4_4_ = 0;
            local_a8.elemsize._0_4_ = 0;
            local_a8.elemsize._4_4_ = 0;
            local_a8.elempack = 0;
            local_a8.dims = 0;
            local_a8.w = 0;
            local_a8.h = 0;
            local_a8.d = 0;
            local_a8.c = 0;
            uVar13 = *(int *)&pLVar4[2].support_tensor_storage *
                     *(int *)&pLVar4[2].support_reserved_6;
            if (0 < (int)uVar13) {
              memset(*ppMVar1,0,(ulong)uVar13 << 2);
            }
          }
          iVar12._0_1_ = pLVar4[1].one_blob_only;
          iVar12._1_1_ = pLVar4[1].support_inplace;
          iVar12._2_1_ = pLVar4[1].support_vulkan;
          iVar12._3_1_ = pLVar4[1].support_packing;
          if (0 < iVar11) {
            sVar15 = pLVar4[1].name.field_2._M_allocated_capacity;
            pMVar9 = pLVar4[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            iVar14 = (int)((long)iVar12 / (long)iVar11);
            sVar20 = 0;
            do {
              if (0 < iVar14) {
                uVar18 = 0;
                do {
                  *(float *)(sVar15 + uVar18 * 4) =
                       local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[sVar20] * *(float *)(sVar15 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (((long)iVar12 / (long)iVar11 & 0xffffffffU) != uVar18);
              }
              *(float *)((long)&pMVar9->data + sVar20 * 4) =
                   *(float *)((long)&pMVar9->data + sVar20 * 4) *
                   local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar20] +
                   local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar20];
              sVar20 = sVar20 + 1;
              sVar15 = sVar15 + (long)iVar14 * 4;
            } while (sVar20 != __n);
          }
          if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          iVar11 = *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar11;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar11].producer = (int)lVar16;
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar7->type,0,(char *)(pLVar7->type)._M_string_length,0x55a19a);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != uVar17 + (uVar17 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_innerproduct_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - BatchNorm to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_innerproduct_batchnorm %s %s\n", innerproduct->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (innerproduct->bias_term == 0)
            {
                // init bias as zero
                innerproduct->bias_term = 1;
                innerproduct->bias_data = ncnn::Mat(channels);
                innerproduct->bias_data.fill(0.f);
            }

            const int weight_per_outch = innerproduct->weight_data_size / channels;

            float* weight = innerproduct->weight_data;
            float* bias = innerproduct->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}